

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignerInfo.c
# Opt level: O0

_Bool COSE_Signer_Free(HCOSE_SIGNER hSigner)

{
  _Bool _Var1;
  _Bool fRet;
  COSE_SignerInfo *pSigner;
  HCOSE_SIGNER hSigner_local;
  
  hSigner_local._7_1_ = false;
  _Var1 = IsValidSignerHandle(hSigner);
  if (_Var1) {
    if (*(int *)(hSigner + 0x10) < 2) {
      _COSE_SignerInfo_Free((COSE_SignerInfo *)hSigner);
      _COSE_RemoveFromList(&SignerRoot,(COSE *)hSigner);
      free(hSigner);
      hSigner_local._7_1_ = true;
    }
    else {
      *(int *)(hSigner + 0x10) = *(int *)(hSigner + 0x10) + -1;
      hSigner_local._7_1_ = true;
    }
  }
  return hSigner_local._7_1_;
}

Assistant:

bool COSE_Signer_Free(HCOSE_SIGNER hSigner)
{
	COSE_SignerInfo * pSigner = (COSE_SignerInfo *)hSigner;
	bool fRet = false;

	if (!IsValidSignerHandle(hSigner)) goto errorReturn;

	if (pSigner->m_message.m_refCount > 1) {
		pSigner->m_message.m_refCount--;
		return true;
	}

	_COSE_SignerInfo_Free(pSigner);

	_COSE_RemoveFromList(&SignerRoot, &pSigner->m_message);

	COSE_FREE(pSigner, &pSigner->m_message.m_allocContext);

	fRet = true;
errorReturn:
	return fRet;
}